

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjWeakRefLookupTable::mark_refs(CVmObjWeakRefLookupTable *this,uint state)

{
  vm_lookup_ext *pvVar1;
  CVmObjTable *in_RDI;
  vm_lookup_val *entry;
  uint i;
  vm_lookup_val **bp;
  uint in_stack_ffffffffffffffc8;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  vm_lookup_val *local_28;
  uint local_1c;
  vm_lookup_val **local_18;
  
  pvVar1 = CVmObjLookupTable::get_ext((CVmObjLookupTable *)in_RDI);
  local_1c = pvVar1->bucket_cnt;
  pvVar1 = CVmObjLookupTable::get_ext((CVmObjLookupTable *)in_RDI);
  local_18 = pvVar1->buckets;
  for (; local_1c != 0; local_1c = local_1c - 1) {
    for (local_28 = *local_18; local_28 != (vm_lookup_val *)0x0; local_28 = local_28->nxt) {
      if ((local_28->key).typ == VM_OBJ) {
        CVmObjTable::mark_all_refs(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      }
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::mark_refs(VMG_ uint state)
{
    vm_lookup_val **bp;
    uint i;

    /* note that the default value is weakly referenced, so don't mark it */

    /* run through my buckets */
    for (i = get_ext()->bucket_cnt, bp = get_ext()->buckets ;
         i != 0 ; --i, ++bp)
    {
        const vm_lookup_val *entry;

        /* run through all entries attached to this bucket */
        for (entry = *bp ; entry != 0 ; entry = entry->nxt)
        {
            /* if the key is an object, mark it as referenced */
            if (entry->key.typ == VM_OBJ)
                G_obj_table->mark_all_refs(entry->key.val.obj, state);

            /* 
             *   note that we only reference our value weakly, so do not
             *   mark it here 
             */
        }
    }
}